

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O1

Literal * Saturation::ExtensionalityClauseContainer::getSingleVarEq(Clause *c)

{
  Literal *pLVar1;
  long lVar2;
  Literal *in_RSI;
  bool bVar3;
  
  lVar2 = 0;
  do {
    pLVar1 = c->_literals[lVar2];
    if ((-1 < *(int *)&(pLVar1->super_Term).field_0xc) ||
       (bVar3 = true, ((pLVar1->super_Term)._args[0]._content & 4) == 0)) {
      bVar3 = false;
      pLVar1 = in_RSI;
    }
  } while ((!bVar3) &&
          (bVar3 = (ulong)((uint)*(undefined8 *)&c->field_0x38 & 0xfffff) - 1 != lVar2,
          lVar2 = lVar2 + 1, in_RSI = pLVar1, bVar3));
  return pLVar1;
}

Assistant:

Literal* ExtensionalityClauseContainer::getSingleVarEq(Clause* c) {
  for (unsigned i = 0; i < c->length(); ++i) {
    Literal* varEq = (*c)[i];
    if (varEq->isTwoVarEquality() && varEq->isPositive()) {
      return varEq;
      break;
    }
  }
  ASSERTION_VIOLATION;
}